

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderMaxCombinedTextureUnitsTest::getShaderParts
          (GeometryShaderMaxCombinedTextureUnitsTest *this,GLchar ***out_fragment_shader_parts,
          uint *out_n_fragment_shader_parts,GLchar ***out_geometry_shader_parts,
          uint *out_n_geometry_shader_parts,GLchar ***out_vertex_shader_parts,
          uint *out_n_vertex_shader_parts)

{
  uint uVar1;
  int iVar2;
  deUint32 err;
  uint uVar3;
  undefined4 extraout_var;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  stringstream stream_vertex;
  stringstream stream_geometry;
  stringstream stream_fragment;
  long *local_4e8 [2];
  long local_4d8 [2];
  long *local_4c8 [2];
  long local_4b8 [14];
  ios_base aiStack_448 [264];
  long *local_340 [2];
  long local_330 [14];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base aiStack_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x868))(0x8b4d,&this->m_max_combined_texture_units);
  (**(code **)(lVar4 + 0x868))(0x8b4c,&this->m_max_vertex_texture_units);
  (**(code **)(lVar4 + 0x868))
            ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_glExtTokens.
             MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,&this->m_max_geometry_texture_units);
  (**(code **)(lVar4 + 0x868))(0x8872,&this->m_max_fragment_texture_units);
  err = (**(code **)(lVar4 + 0x800))();
  glu::checkError(err,"glGetIntegerv() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                  ,0xc2e);
  uVar3 = this->m_max_vertex_texture_units;
  uVar1 = this->m_max_geometry_texture_units;
  iVar2 = this->m_max_combined_texture_units;
  uVar5 = this->m_max_fragment_texture_units;
  uVar6 = uVar5;
  if ((int)uVar5 < (int)uVar1) {
    uVar6 = uVar1;
  }
  if ((int)uVar6 < (int)uVar3) {
    uVar6 = uVar3;
  }
  this->m_n_texture_units = uVar6;
  if ((int)(iVar2 - 2U) < (int)uVar3) {
    uVar3 = iVar2 - 2U;
  }
  if ((int)uVar3 < 2) {
    uVar3 = 1;
  }
  this->m_n_vertex_texture_units = uVar3;
  uVar7 = ~uVar3 + iVar2;
  if ((int)uVar5 <= (int)(~uVar3 + iVar2)) {
    uVar7 = uVar5;
  }
  if ((int)uVar7 < 2) {
    uVar7 = 1;
  }
  this->m_n_fragment_texture_units = uVar7;
  uVar5 = (iVar2 - uVar3) - uVar7;
  if ((int)uVar1 <= (int)uVar5) {
    uVar5 = uVar1;
  }
  if ((int)uVar5 < 2) {
    uVar5 = 1;
  }
  this->m_n_geometry_texture_units = uVar5;
  if ((int)uVar7 < (int)uVar5) {
    uVar5 = uVar7;
  }
  if ((int)uVar3 < (int)uVar5) {
    uVar5 = uVar3;
  }
  this->m_min_texture_units = uVar5;
  this->m_texture_width = uVar6;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::operator<<(local_1a8,this->m_n_fragment_texture_units);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&this->m_n_fragment_texture_units_string,(string *)local_340);
  if (local_340[0] != local_330) {
    operator_delete(local_340[0],local_330[0] + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  std::ostream::operator<<(local_330,this->m_n_geometry_texture_units);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&this->m_n_geometry_texture_units_string,(string *)local_4c8);
  if (local_4c8[0] != local_4b8) {
    operator_delete(local_4c8[0],local_4b8[0] + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_4c8);
  std::ostream::operator<<(local_4b8,this->m_n_vertex_texture_units);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&this->m_n_vertex_texture_units_string,(string *)local_4e8);
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],local_4d8[0] + 1);
  }
  this->m_fragment_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GPU_SHADER5_ENABLE}\n\nprecision highp float;\n\n// NUMBER_OF_POINTS == NUMBER_OF_SAMPLERS\n#define NUMBER_OF_POINTS "
  ;
  this->m_fragment_shader_parts[1] = (this->m_n_fragment_texture_units_string)._M_dataplus._M_p;
  this->m_fragment_shader_parts[2] =
       "u\n\n                     uniform highp usampler2D sampler[NUMBER_OF_POINTS];\nflat                 in      int        gs_fs_vertex_id;\nflat                 in      uint       gs_fs_vertex_sum;\nflat                 in      uint       gs_fs_geometry_sum;\nlayout(location = 0) out     uint       fs_out_color;\n\nvoid main()\n{\n    uint sum = 0u;\n\n    for (uint i = 0u; i < uint(gs_fs_vertex_id); ++i)\n    {\n        sum += texture(sampler[i], vec2(0.0, 0.0)).r;\n    }\n    fs_out_color = sum + gs_fs_vertex_sum + gs_fs_geometry_sum;\n}\n"
  ;
  *out_fragment_shader_parts = this->m_fragment_shader_parts;
  *out_n_fragment_shader_parts = 3;
  this->m_geometry_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GPU_SHADER5_ENABLE}\n\nprecision highp float;\n\nlayout(points)                   in;\nlayout(points, max_vertices = 1) out;\n\n#define NUMBER_OF_POINTS "
  ;
  this->m_geometry_shader_parts[1] = (this->m_n_geometry_texture_units_string)._M_dataplus._M_p;
  this->m_geometry_shader_parts[2] =
       "u\n\n// NUMBER_OF_POINTS == NUMBER_OF_SAMPLERS\n     uniform highp usampler2D sampler[NUMBER_OF_POINTS];\nflat in      int        vs_gs_vertex_id[1];\nflat in      uint       vs_gs_sum      [1];\nflat out     int        gs_fs_vertex_id;\nflat out     uint       gs_fs_vertex_sum;\nflat out     uint       gs_fs_geometry_sum;\n\nvoid main()\n{\n    uint sum = 0u;\n\n    for (uint i = 0u; i < uint(vs_gs_vertex_id[0]); ++i)\n    {\n        sum += texture(sampler[i], vec2(0.0, 0.0)).r;\n    }\n\n    gl_Position        = gl_in[0].gl_Position;\n    gs_fs_vertex_id    = vs_gs_vertex_id[0];\n    gs_fs_vertex_sum   = vs_gs_sum      [0];\n    gs_fs_geometry_sum = sum;\n    EmitVertex();\n    EndPrimitive();\n}\n"
  ;
  *out_geometry_shader_parts = this->m_geometry_shader_parts;
  *out_n_geometry_shader_parts = 3;
  this->m_vertex_shader_parts[0] =
       "${VERSION}\n\n${GEOMETRY_SHADER_REQUIRE}\n${GPU_SHADER5_ENABLE}\n\nprecision highp float;\n\n#define NUMBER_OF_POINTS "
  ;
  this->m_vertex_shader_parts[1] = (this->m_n_vertex_texture_units_string)._M_dataplus._M_p;
  this->m_vertex_shader_parts[2] =
       "u\n\n// NUMBER_OF_POINTS == NUMBER_OF_SAMPLERS\n     uniform highp usampler2D sampler[NUMBER_OF_POINTS];flat out     int        vs_gs_vertex_id;\nflat out     uint       vs_gs_sum;\n\nvoid main()\n{\n    uint sum = 0u;\n\n    for (uint i = 0u; i < uint(gl_VertexID); ++i)\n    {\n        sum += texture(sampler[i], vec2(0.0, 0.0)).r;\n    }\n\n    gl_Position     = vec4(-1.0 + ((2.0 / float(NUMBER_OF_POINTS)) * float(gl_VertexID)) + (1.0 / float(NUMBER_OF_POINTS)), 0, 0, 1.0);\n    vs_gs_vertex_id = gl_VertexID;\n    vs_gs_sum       = sum;\n}\n"
  ;
  *out_vertex_shader_parts = this->m_vertex_shader_parts;
  *out_n_vertex_shader_parts = 3;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_4c8);
  std::ios_base::~ios_base(aiStack_448);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  return;
}

Assistant:

void GeometryShaderMaxCombinedTextureUnitsTest::getShaderParts(const glw::GLchar* const*& out_fragment_shader_parts,
															   unsigned int&			  out_n_fragment_shader_parts,
															   const glw::GLchar* const*& out_geometry_shader_parts,
															   unsigned int&			  out_n_geometry_shader_parts,
															   const glw::GLchar* const*& out_vertex_shader_parts,
															   unsigned int&			  out_n_vertex_shader_parts)
{
	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get maximum number of texture units */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &m_max_combined_texture_units);
	gl.getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &m_max_vertex_texture_units);
	gl.getIntegerv(m_glExtTokens.MAX_GEOMETRY_TEXTURE_IMAGE_UNITS, &m_max_geometry_texture_units);
	gl.getIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &m_max_fragment_texture_units);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call(s) failed");

	m_n_texture_units =
		de::max(m_max_vertex_texture_units, de::max(m_max_geometry_texture_units, m_max_fragment_texture_units));
	m_n_vertex_texture_units = de::max(1, de::min(m_max_combined_texture_units - 2, m_max_vertex_texture_units));
	m_n_fragment_texture_units =
		de::max(1, de::min(m_max_combined_texture_units - m_n_vertex_texture_units - 1, m_max_fragment_texture_units));
	m_n_geometry_texture_units =
		de::max(1, de::min(m_max_combined_texture_units - m_n_vertex_texture_units - m_n_fragment_texture_units,
						   m_max_geometry_texture_units));
	m_min_texture_units =
		de::min(m_n_vertex_texture_units, de::min(m_n_fragment_texture_units, m_n_geometry_texture_units));

	/* Number of drawn points is equal to GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS_EXT */
	m_texture_width = m_n_texture_units * m_point_size;

	/* Prepare texture units string */
	std::stringstream stream_fragment;
	stream_fragment << m_n_fragment_texture_units;
	m_n_fragment_texture_units_string = stream_fragment.str();

	std::stringstream stream_geometry;
	stream_geometry << m_n_geometry_texture_units;
	m_n_geometry_texture_units_string = stream_geometry.str();

	std::stringstream stream_vertex;
	stream_vertex << m_n_vertex_texture_units;
	m_n_vertex_texture_units_string = stream_vertex.str();

	/* Fragment shader parts */
	m_fragment_shader_parts[0] = m_fragment_shader_code_preamble;
	m_fragment_shader_parts[1] = m_n_fragment_texture_units_string.c_str();
	m_fragment_shader_parts[2] = m_fragment_shader_code_body;

	out_fragment_shader_parts   = m_fragment_shader_parts;
	out_n_fragment_shader_parts = 3;

	/* Geometry shader parts */
	m_geometry_shader_parts[0] = m_geometry_shader_code_preamble;
	m_geometry_shader_parts[1] = m_n_geometry_texture_units_string.c_str();
	m_geometry_shader_parts[2] = m_geometry_shader_code_body;

	out_geometry_shader_parts   = m_geometry_shader_parts;
	out_n_geometry_shader_parts = 3;

	/* Vertex shader parts */
	m_vertex_shader_parts[0] = m_vertex_shader_code_preamble;
	m_vertex_shader_parts[1] = m_n_vertex_texture_units_string.c_str();
	m_vertex_shader_parts[2] = m_vertex_shader_code_body;

	out_vertex_shader_parts   = m_vertex_shader_parts;
	out_n_vertex_shader_parts = 3;
}